

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.h
# Opt level: O1

void __thiscall
leveldb::VersionEdit::AddFile
          (VersionEdit *this,int level,uint64_t file,uint64_t file_size,InternalKey *smallest,
          InternalKey *largest)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long in_FS_OFFSET;
  FileMetaData f;
  int local_e4;
  pair<int,_leveldb::FileMetaData> local_e0;
  FileMetaData local_80;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_80.refs = 0;
  local_80.allowed_seeks = 0x40000000;
  paVar1 = &local_80.smallest.rep_.field_2;
  local_80.smallest.rep_._M_string_length = 0;
  local_80.smallest.rep_.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_80.largest.rep_.field_2;
  local_80.largest.rep_._M_string_length = 0;
  local_80.largest.rep_.field_2._M_local_buf[0] = '\0';
  local_e4 = level;
  local_80.number = file;
  local_80.file_size = file_size;
  local_80.smallest.rep_._M_dataplus._M_p = (pointer)paVar1;
  local_80.largest.rep_._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&local_80.smallest.rep_,&smallest->rep_);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&local_80.largest.rep_,&largest->rep_);
  std::pair<int,_leveldb::FileMetaData>::pair<int_&,_leveldb::FileMetaData_&,_true>
            (&local_e0,&local_e4,&local_80);
  std::
  vector<std::pair<int,leveldb::FileMetaData>,std::allocator<std::pair<int,leveldb::FileMetaData>>>
  ::emplace_back<std::pair<int,leveldb::FileMetaData>>
            ((vector<std::pair<int,leveldb::FileMetaData>,std::allocator<std::pair<int,leveldb::FileMetaData>>>
              *)&this->new_files_,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.second.largest.rep_._M_dataplus._M_p != &local_e0.second.largest.rep_.field_2) {
    operator_delete(local_e0.second.largest.rep_._M_dataplus._M_p,
                    local_e0.second.largest.rep_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.second.smallest.rep_._M_dataplus._M_p != &local_e0.second.smallest.rep_.field_2) {
    operator_delete(local_e0.second.smallest.rep_._M_dataplus._M_p,
                    local_e0.second.smallest.rep_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.largest.rep_._M_dataplus._M_p != paVar2) {
    operator_delete(local_80.largest.rep_._M_dataplus._M_p,
                    CONCAT71(local_80.largest.rep_.field_2._M_allocated_capacity._1_7_,
                             local_80.largest.rep_.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.smallest.rep_._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.smallest.rep_._M_dataplus._M_p,
                    CONCAT71(local_80.smallest.rep_.field_2._M_allocated_capacity._1_7_,
                             local_80.smallest.rep_.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddFile(int level, uint64_t file, uint64_t file_size,
               const InternalKey& smallest, const InternalKey& largest) {
    FileMetaData f;
    f.number = file;
    f.file_size = file_size;
    f.smallest = smallest;
    f.largest = largest;
    new_files_.push_back(std::make_pair(level, f));
  }